

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IOEffect::IOEffect
          (IOEffect *this,IOStatus S,IOLinkType LT,IOEffectType ET,KUINT8 DutyCycle,KUINT16 Duration
          ,KUINT16 Process)

{
  KUINT8 local_1c;
  KUINT16 Duration_local;
  KUINT8 DutyCycle_local;
  IOEffectType ET_local;
  IOLinkType LT_local;
  IOStatus S_local;
  IOEffect *this_local;
  
  StandardVariable::StandardVariable(&this->super_StandardVariable);
  (this->super_StandardVariable).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IOEffect_004f41b0;
  ET_local._0_1_ = (undefined1)S;
  (this->super_StandardVariable).field_0xe = (undefined1)ET_local;
  Duration_local._0_1_ = (undefined1)LT;
  (this->super_StandardVariable).field_0xf = (undefined1)Duration_local;
  local_1c = (KUINT8)ET;
  this->m_ui8Eff = local_1c;
  this->m_ui8EffDtyCyc = '\0';
  this->m_ui16EffDur = Duration;
  this->m_ui16Proc = Process;
  this->m_ui16Padding = 0;
  SetEffectDutyCycle(this,DutyCycle);
  (this->super_StandardVariable).m_ui32Type = 0x157c;
  (this->super_StandardVariable).m_ui16Length = 0x10;
  return;
}

Assistant:

IOEffect::IOEffect(IOStatus S, IOLinkType LT, IOEffectType ET, KUINT8 DutyCycle,
                   KUINT16 Duration, KUINT16 Process) noexcept(false) :
    m_ui8Status( S ),
    m_ui8LnkTyp( LT ),
    m_ui8Eff( ET ),
    m_ui8EffDtyCyc( 0 ),
    m_ui16EffDur( Duration ),
    m_ui16Proc( Process ),
    m_ui16Padding( 0 )
{
    // Set duty cycle, may cause exception if the value is not valid.
    SetEffectDutyCycle( DutyCycle );

    m_ui32Type = IOEffectRecord;
    m_ui16Length = IO_EFFECT_TYPE_SIZE;
}